

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O3

void dtd_chain(DLword type)

{
  uint uVar1;
  undefined6 in_register_0000003a;
  char *__s;
  ulong uVar2;
  uint *puVar3;
  
  uVar1 = *(uint *)((long)DTDspace +
                   (CONCAT62(in_register_0000003a,type) & 0xffffffff) * 4 +
                   (ulong)(uint)((int)CONCAT62(in_register_0000003a,type) << 5) + 8);
  uVar2 = (ulong)uVar1;
  if ((uVar1 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar2);
  }
  __s = "That\'s All !";
  if (*(int *)(Lisp_world + uVar2) != 0) {
    puVar3 = (uint *)(Lisp_world + uVar2);
    do {
      if ((*(ushort *)((ulong)((uint)(uVar2 >> 8) & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) !=
          type) {
        __s = "BAD cell in next dtdfree";
        goto LAB_00134a0e;
      }
      print((LispPTR)uVar2);
      putchar(10);
      uVar2 = (ulong)*puVar3;
      if ((*puVar3 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar2);
      }
      puVar3 = (uint *)(Lisp_world + uVar2);
    } while (*puVar3 != 0);
    __s = "That\'s All !";
  }
LAB_00134a0e:
  puts(__s);
  return;
}

Assistant:

void dtd_chain(DLword type) {
  struct dtd *dtdp;
  LispPTR next;
  LispPTR *next68k;

  dtdp = (struct dtd *)GetDTD(type);

  next = dtdp->dtd_free;
  next68k = (LispPTR *)NativeAligned4FromLAddr(next);

  while ((*next68k) != 0) {
    if (type != GetTypeNumber(next)) {
      printf("BAD cell in next dtdfree\n");
      return;
    }
    print(next);
    putchar('\n');

    next = *next68k;
    next68k = (LispPTR *)NativeAligned4FromLAddr(next);
  }
  printf("That's All !\n");

}